

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sig_pause.c
# Opt level: O2

void sig_pause(void)

{
  sigset_t ss;
  sigset_t sStack_88;
  
  sigemptyset(&sStack_88);
  sigsuspend(&sStack_88);
  return;
}

Assistant:

void sig_pause(void)
{
#ifdef HASSIGPROCMASK
  sigset_t ss;
  sigemptyset(&ss);
  sigsuspend(&ss);
#else
  sigpause(0);
#endif
}